

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_visitor.hpp
# Opt level: O1

LogicalType * __thiscall
duckdb::TypeVisitor::
VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
          (LogicalType *__return_storage_ptr__,TypeVisitor *this,LogicalType *type,
          anon_class_8_1_669485c1 *func)

{
  TypeVisitor TVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *__x;
  long lVar4;
  LogicalType *pLVar5;
  idx_t index;
  uint *func_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this_00;
  TypeVisitor *pTVar6;
  element_type *peVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  LogicalType value;
  child_list_t<LogicalType> children;
  LogicalType local_f0;
  LogicalType local_d8;
  LogicalType local_c0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  optional_idx local_98;
  LogicalType local_90;
  LogicalType local_78;
  child_list_t<LogicalType> local_60;
  child_list_t<LogicalType> local_48;
  
  func_00 = &switchD_00d6b89b::switchdataD_01dc3bac;
  switch(*this) {
  case (TypeVisitor)0x64:
    __x = &StructType::GetChildTypes_abi_cxx11_((LogicalType *)this)->
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_d8,__x);
    if ((element_type *)local_d8._0_8_ !=
        local_d8.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      pTVar6 = (TypeVisitor *)
               ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_d8._0_8_ + 0x10))->_M_local_buf + 0x10);
      do {
        VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
                  (&local_f0,pTVar6,type,(anon_class_8_1_669485c1 *)func_00);
        _Var3._M_pi = local_f0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        peVar7 = local_f0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *pTVar6 = (TypeVisitor)local_f0.id_;
        pTVar6[1] = (TypeVisitor)local_f0.physical_type_;
        uVar8 = *(undefined4 *)(pTVar6 + 8);
        uVar10 = *(undefined4 *)(pTVar6 + 0x10);
        *(undefined8 *)(pTVar6 + 8) = 0;
        *(undefined8 *)(pTVar6 + 0x10) = 0;
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar6 + 0x10);
        *(element_type **)(pTVar6 + 8) = peVar7;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar6 + 0x10) = _Var3._M_pi;
        uVar9 = *(undefined4 *)(pTVar6 + 0xc);
        uVar11 = *(undefined4 *)(pTVar6 + 0x14);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_a8 = uVar8;
          uStack_a4 = *(undefined4 *)(pTVar6 + 0xc);
          uStack_a0 = uVar10;
          uStack_9c = *(undefined4 *)(pTVar6 + 0x14);
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          uVar8 = local_a8;
          uVar9 = uStack_a4;
          uVar10 = uStack_a0;
          uVar11 = uStack_9c;
        }
        _Var3._M_pi = local_f0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)CONCAT44(uVar9,uVar8);
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = uVar11;
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = uVar10;
        if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
        }
        LogicalType::~LogicalType(&local_f0);
        peVar7 = (element_type *)(pTVar6 + 0x18);
        pTVar6 = pTVar6 + 0x38;
      } while (peVar7 != local_d8.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_48,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_d8);
    LogicalType::STRUCT(&local_f0,&local_48);
    if ((TypeVisitor)local_f0.physical_type_ == (TypeVisitor)0x17) {
LAB_00d6b993:
      lVar4 = 0x20;
LAB_00d6bce8:
      **(long **)type = **(long **)type + lVar4;
    }
    else {
      if ((TypeVisitor)local_f0.physical_type_ == (TypeVisitor)0xc8) {
        lVar4 = 8;
        goto LAB_00d6bce8;
      }
      if ((TypeVisitor)local_f0.physical_type_ == (TypeVisitor)0x1d) goto LAB_00d6b993;
    }
    **(long **)type = **(long **)type + 2;
    LogicalType::LogicalType(__return_storage_ptr__,&local_f0);
    LogicalType::~LogicalType(&local_f0);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_48;
LAB_00d6bd47:
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector(this_00);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_d8);
    return __return_storage_ptr__;
  case (TypeVisitor)0x65:
    pLVar5 = ListType::GetChildType((LogicalType *)this);
    LogicalType::LogicalType(&local_d8,pLVar5);
    VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
              (&local_c0,(TypeVisitor *)&local_d8,type,(anon_class_8_1_669485c1 *)func_00);
    LogicalType::LIST(&local_f0,&local_c0);
    if ((TypeVisitor)local_f0.physical_type_ == (TypeVisitor)0x17) {
LAB_00d6baaa:
      lVar4 = 0x20;
LAB_00d6bc41:
      **(long **)type = **(long **)type + lVar4;
    }
    else {
      if ((TypeVisitor)local_f0.physical_type_ == (TypeVisitor)0xc8) {
        lVar4 = 8;
        goto LAB_00d6bc41;
      }
      if ((TypeVisitor)local_f0.physical_type_ == (TypeVisitor)0x1d) goto LAB_00d6baaa;
    }
    **(long **)type = **(long **)type + 2;
    LogicalType::LogicalType(__return_storage_ptr__,&local_f0);
    break;
  case (TypeVisitor)0x66:
    pLVar5 = MapType::KeyType((LogicalType *)this);
    LogicalType::LogicalType(&local_d8,pLVar5);
    pLVar5 = MapType::ValueType((LogicalType *)this);
    LogicalType::LogicalType(&local_f0,pLVar5);
    VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
              (&local_78,(TypeVisitor *)&local_d8,type,(anon_class_8_1_669485c1 *)func_00);
    VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
              (&local_90,(TypeVisitor *)&local_f0,type,(anon_class_8_1_669485c1 *)func_00);
    LogicalType::MAP(&local_c0,&local_78,&local_90);
    if (local_c0.physical_type_ == LIST) {
LAB_00d6ba4b:
      lVar4 = 0x20;
LAB_00d6bc92:
      **(long **)type = **(long **)type + lVar4;
    }
    else {
      if (local_c0.physical_type_ == VARCHAR) {
        lVar4 = 8;
        goto LAB_00d6bc92;
      }
      if (local_c0.physical_type_ == ARRAY) goto LAB_00d6ba4b;
    }
    **(long **)type = **(long **)type + 2;
    LogicalType::LogicalType(__return_storage_ptr__,&local_c0);
    LogicalType::~LogicalType(&local_c0);
    LogicalType::~LogicalType(&local_90);
    LogicalType::~LogicalType(&local_78);
    pLVar5 = &local_f0;
    goto LAB_00d6bcd2;
  default:
    TVar1 = this[1];
    if (TVar1 == (TypeVisitor)0x17) {
LAB_00d6b9bb:
      lVar4 = 0x20;
    }
    else {
      if (TVar1 != (TypeVisitor)0xc8) {
        if (TVar1 != (TypeVisitor)0x1d) goto LAB_00d6bc25;
        goto LAB_00d6b9bb;
      }
      lVar4 = 8;
    }
    **(long **)type = **(long **)type + lVar4;
LAB_00d6bc25:
    **(long **)type = **(long **)type + 2;
    LogicalType::LogicalType(__return_storage_ptr__,(LogicalType *)this);
    return __return_storage_ptr__;
  case (TypeVisitor)0x6b:
    UnionType::CopyMemberTypes_abi_cxx11_
              ((child_list_t<LogicalType> *)&local_d8,(UnionType *)this,type);
    if ((element_type *)local_d8._0_8_ !=
        local_d8.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      pTVar6 = (TypeVisitor *)
               ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_d8._0_8_ + 0x10))->_M_local_buf + 0x10);
      do {
        VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
                  (&local_f0,pTVar6,type,(anon_class_8_1_669485c1 *)func_00);
        _Var3._M_pi = local_f0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        peVar7 = local_f0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *pTVar6 = (TypeVisitor)local_f0.id_;
        pTVar6[1] = (TypeVisitor)local_f0.physical_type_;
        uVar8 = *(undefined4 *)(pTVar6 + 8);
        uVar10 = *(undefined4 *)(pTVar6 + 0x10);
        *(undefined8 *)(pTVar6 + 8) = 0;
        *(undefined8 *)(pTVar6 + 0x10) = 0;
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar6 + 0x10);
        *(element_type **)(pTVar6 + 8) = peVar7;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar6 + 0x10) = _Var3._M_pi;
        uVar9 = *(undefined4 *)(pTVar6 + 0xc);
        uVar11 = *(undefined4 *)(pTVar6 + 0x14);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_a8 = uVar8;
          uStack_a4 = *(undefined4 *)(pTVar6 + 0xc);
          uStack_a0 = uVar10;
          uStack_9c = *(undefined4 *)(pTVar6 + 0x14);
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          uVar8 = local_a8;
          uVar9 = uStack_a4;
          uVar10 = uStack_a0;
          uVar11 = uStack_9c;
        }
        _Var3._M_pi = local_f0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)CONCAT44(uVar9,uVar8);
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = uVar11;
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = uVar10;
        if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
        }
        LogicalType::~LogicalType(&local_f0);
        peVar7 = (element_type *)(pTVar6 + 0x18);
        pTVar6 = pTVar6 + 0x38;
      } while (peVar7 != local_d8.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_60,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_d8);
    LogicalType::UNION(&local_f0,&local_60);
    if ((TypeVisitor)local_f0.physical_type_ == (TypeVisitor)0x17) {
LAB_00d6bba2:
      lVar4 = 0x20;
LAB_00d6bd1b:
      **(long **)type = **(long **)type + lVar4;
    }
    else {
      if ((TypeVisitor)local_f0.physical_type_ == (TypeVisitor)0xc8) {
        lVar4 = 8;
        goto LAB_00d6bd1b;
      }
      if ((TypeVisitor)local_f0.physical_type_ == (TypeVisitor)0x1d) goto LAB_00d6bba2;
    }
    **(long **)type = **(long **)type + 2;
    LogicalType::LogicalType(__return_storage_ptr__,&local_f0);
    LogicalType::~LogicalType(&local_f0);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_60;
    goto LAB_00d6bd47;
  case (TypeVisitor)0x6c:
    pLVar5 = ArrayType::GetChildType((LogicalType *)this);
    LogicalType::LogicalType(&local_d8,pLVar5);
    VisitReplace<duckdb::BuildProbeSideOptimizer::GetBuildSize(duckdb::vector<duckdb::LogicalType,true>,unsigned_long)::__0&>
              (&local_c0,(TypeVisitor *)&local_d8,type,(anon_class_8_1_669485c1 *)func_00);
    index = ArrayType::GetSize((LogicalType *)this);
    optional_idx::optional_idx(&local_98,index);
    LogicalType::ARRAY(&local_f0,&local_c0,local_98);
    if ((TypeVisitor)local_f0.physical_type_ == (TypeVisitor)0x17) {
LAB_00d6bc13:
      lVar4 = 0x20;
LAB_00d6bc62:
      **(long **)type = **(long **)type + lVar4;
    }
    else {
      if ((TypeVisitor)local_f0.physical_type_ == (TypeVisitor)0xc8) {
        lVar4 = 8;
        goto LAB_00d6bc62;
      }
      if ((TypeVisitor)local_f0.physical_type_ == (TypeVisitor)0x1d) goto LAB_00d6bc13;
    }
    **(long **)type = **(long **)type + 2;
    LogicalType::LogicalType(__return_storage_ptr__,&local_f0);
  }
  LogicalType::~LogicalType(&local_f0);
  pLVar5 = &local_c0;
LAB_00d6bcd2:
  LogicalType::~LogicalType(pLVar5);
  LogicalType::~LogicalType(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

inline LogicalType TypeVisitor::VisitReplace(const LogicalType &type, F &&func) {
	switch (type.id()) {
	case LogicalTypeId::STRUCT: {
		auto children = StructType::GetChildTypes(type);
		for (auto &child : children) {
			child.second = VisitReplace(child.second, func);
		}
		return func(LogicalType::STRUCT(children));
	}
	case LogicalTypeId::UNION: {
		auto children = UnionType::CopyMemberTypes(type);
		for (auto &child : children) {
			child.second = VisitReplace(child.second, func);
		}
		return func(LogicalType::UNION(children));
	}
	case LogicalTypeId::LIST: {
		auto child = ListType::GetChildType(type);
		return func(LogicalType::LIST(VisitReplace(child, func)));
	}
	case LogicalTypeId::ARRAY: {
		auto child = ArrayType::GetChildType(type);
		return func(LogicalType::ARRAY(VisitReplace(child, func), ArrayType::GetSize(type)));
	}
	case LogicalTypeId::MAP: {
		auto key = MapType::KeyType(type);
		auto value = MapType::ValueType(type);
		return func(LogicalType::MAP(VisitReplace(key, func), VisitReplace(value, func)));
	}
	default:
		return func(type);
	}
}